

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Index * sqlite3FindIndex(sqlite3 *db,char *zName,char *zDb)

{
  uint uVar1;
  Db *pDVar2;
  Schema *pSVar3;
  uint uVar4;
  int iVar5;
  HashElem *pHVar6;
  uint uVar7;
  
  uVar1 = db->nDb;
  if (0 < (int)uVar1) {
    pDVar2 = db->aDb;
    uVar7 = 0;
    do {
      uVar4 = uVar7 < 2 ^ uVar7;
      pSVar3 = pDVar2[uVar4].pSchema;
      if ((zDb == (char *)0x0) || (iVar5 = sqlite3StrICmp(zDb,pDVar2[uVar4].zDbSName), iVar5 == 0))
      {
        pHVar6 = findElementWithHash(&pSVar3->idxHash,zName,(uint *)0x0);
        if ((Index *)pHVar6->data != (Index *)0x0) {
          return (Index *)pHVar6->data;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
  }
  return (Index *)0x0;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3FindIndex(sqlite3 *db, const char *zName, const char *zDb){
  Index *p = 0;
  int i;
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    Schema *pSchema = db->aDb[j].pSchema;
    assert( pSchema );
    if( zDb && sqlite3StrICmp(zDb, db->aDb[j].zDbSName) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&pSchema->idxHash, zName);
    if( p ) break;
  }
  return p;
}